

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O1

int MRIStepResize(void *arkode_mem,N_Vector y0,realtype t0,ARKVecResizeFn resize,void *resize_data)

{
  MRIStepInnerStepper p_Var1;
  N_Vector p_Var2;
  int iVar3;
  SUNNonlinearSolver NLS;
  char *msgfmt;
  uint liw_diff;
  int lrw_diff;
  void *resize_data_00;
  sunindextype liw1;
  sunindextype lrw1;
  N_Vector local_58;
  void *local_50;
  ulong local_48;
  ARKodeMRIStepMem step_mem;
  ARKodeMem ark_mem;
  ulong uVar4;
  
  local_58 = (N_Vector)t0;
  iVar3 = mriStep_AccessStepMem(arkode_mem,"MRIStepResize",&ark_mem,&step_mem);
  if (iVar3 != 0) {
    return iVar3;
  }
  liw1 = 0;
  lrw1 = 0;
  local_50 = resize_data;
  if (y0->ops->nvspace != (_func_void_N_Vector_sunindextype_ptr_sunindextype_ptr *)0x0) {
    N_VSpace(y0,&lrw1,&liw1);
  }
  resize_data_00 = local_50;
  p_Var2 = local_58;
  lrw_diff = lrw1 - ark_mem->lrw1;
  liw_diff = liw1 - ark_mem->liw1;
  uVar4 = (ulong)liw_diff;
  ark_mem->lrw1 = lrw1;
  ark_mem->liw1 = liw1;
  local_58 = y0;
  iVar3 = arkResize(ark_mem,y0,1.0,(realtype)p_Var2,resize,local_50);
  p_Var2 = local_58;
  if (iVar3 != 0) {
    msgfmt = "Unable to resize main ARKode infrastructure";
    goto LAB_0041230c;
  }
  if ((((((step_mem->Fse == (N_Vector *)0x0) ||
         (iVar3 = arkResizeVecArray(resize,resize_data_00,step_mem->nstages_stored,local_58,
                                    &step_mem->Fse,lrw_diff,&ark_mem->lrw,liw_diff,&ark_mem->liw),
         iVar3 != 0)) &&
        ((step_mem->Fsi == (N_Vector *)0x0 ||
         (iVar3 = arkResizeVecArray(resize,resize_data_00,step_mem->nstages_stored,p_Var2,
                                    &step_mem->Fsi,lrw_diff,&ark_mem->lrw,liw_diff,&ark_mem->liw),
         iVar3 != 0)))) &&
       ((step_mem->sdata == (N_Vector)0x0 ||
        (iVar3 = arkResizeVec(ark_mem,resize,resize_data_00,lrw_diff,liw_diff,p_Var2,
                              &step_mem->sdata), iVar3 != 0)))) &&
      ((step_mem->zpred == (N_Vector)0x0 ||
       (iVar3 = arkResizeVec(ark_mem,resize,resize_data_00,lrw_diff,liw_diff,p_Var2,&step_mem->zpred
                            ), iVar3 != 0)))) &&
     ((step_mem->zcor == (N_Vector)0x0 ||
      (iVar3 = arkResizeVec(ark_mem,resize,resize_data_00,lrw_diff,liw_diff,p_Var2,&step_mem->zcor),
      iVar3 != 0)))) {
    if ((step_mem->NLS == (SUNNonlinearSolver)0x0) || (step_mem->ownNLS == 0)) {
LAB_004122ab:
      p_Var1 = step_mem->stepper;
      if ((p_Var1 != (MRIStepInnerStepper)0x0) &&
         (iVar3 = arkResizeVecArray(resize,resize_data_00,p_Var1->nforcing,p_Var2,&p_Var1->forcing,
                                    lrw_diff,&p_Var1->lrw,(sunindextype)uVar4,&p_Var1->liw),
         iVar3 == 0)) {
        if (step_mem->NLS == (SUNNonlinearSolver)0x0) {
          return 0;
        }
        step_mem->nsetups = 0;
        return 0;
      }
      goto LAB_004122ea;
    }
    local_48 = uVar4;
    iVar3 = SUNNonlinSolFree(step_mem->NLS);
    if (iVar3 != 0) {
      return iVar3;
    }
    step_mem->NLS = (SUNNonlinearSolver)0x0;
    step_mem->ownNLS = 0;
    NLS = SUNNonlinSol_Newton(p_Var2,ark_mem->sunctx);
    if (NLS == (SUNNonlinearSolver)0x0) {
      msgfmt = "Error creating default Newton solver";
    }
    else {
      iVar3 = MRIStepSetNonlinearSolver(ark_mem,NLS);
      if (iVar3 == 0) {
        step_mem->ownNLS = 1;
        uVar4 = local_48;
        resize_data_00 = local_50;
        goto LAB_004122ab;
      }
      msgfmt = "Error attaching default Newton solver";
    }
  }
  else {
LAB_004122ea:
    msgfmt = "Unable to resize vector";
  }
  iVar3 = -0x14;
LAB_0041230c:
  arkProcessError(ark_mem,iVar3,"ARKode::MRIStep","MRIStepResize",msgfmt);
  return iVar3;
}

Assistant:

int MRIStepResize(void *arkode_mem, N_Vector y0, realtype t0,
                  ARKVecResizeFn resize, void *resize_data)
{
  ARKodeMem ark_mem;
  ARKodeMRIStepMem step_mem;
  SUNNonlinearSolver NLS;
  sunindextype lrw1, liw1, lrw_diff, liw_diff;
  int retval;

  /* access ARKodeMRIStepMem structure */
  retval = mriStep_AccessStepMem(arkode_mem, "MRIStepResize",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) return(retval);

  /* Determing change in vector sizes */
  lrw1 = liw1 = 0;
  if (y0->ops->nvspace != NULL)
    N_VSpace(y0, &lrw1, &liw1);
  lrw_diff = lrw1 - ark_mem->lrw1;
  liw_diff = liw1 - ark_mem->liw1;
  ark_mem->lrw1 = lrw1;
  ark_mem->liw1 = liw1;

  /* resize ARKode infrastructure memory (use hscale = 1.0) */
  retval = arkResize(ark_mem, y0, RCONST(1.0), t0, resize, resize_data);
  if (retval != ARK_SUCCESS) {
    arkProcessError(ark_mem, retval, "ARKode::MRIStep", "MRIStepResize",
                    "Unable to resize main ARKode infrastructure");
    return(retval);
  }

  /* Resize Fse */
  if (step_mem->Fse) {
    if (!arkResizeVecArray(resize, resize_data,
                           step_mem->nstages_stored, y0, &(step_mem->Fse),
                           lrw_diff, &(ark_mem->lrw),
                           liw_diff, &(ark_mem->liw))) {
      arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode::MRIStep",
                      "MRIStepResize", "Unable to resize vector");
      return(ARK_MEM_FAIL);
    }
  }

  /* Resize Fsi */
  if (step_mem->Fsi) {
    if (!arkResizeVecArray(resize, resize_data,
                           step_mem->nstages_stored, y0, &(step_mem->Fsi),
                           lrw_diff, &(ark_mem->lrw),
                           liw_diff, &(ark_mem->liw))) {
      arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode::MRIStep",
                      "MRIStepResize", "Unable to resize vector");
      return(ARK_MEM_FAIL);
    }
  }

  /* Resize the nonlinear solver interface vectors (if applicable) */
  if (step_mem->sdata != NULL)
    if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff,
                      liw_diff, y0, &step_mem->sdata)) {
      arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode::MRIStep",
                      "MRIStepResize", "Unable to resize vector");
      return(ARK_MEM_FAIL);
    }
  if (step_mem->zpred != NULL)
    if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff,
                      liw_diff, y0, &step_mem->zpred)) {
      arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode::MRIStep",
                      "MRIStepResize", "Unable to resize vector");
      return(ARK_MEM_FAIL);
    }
  if (step_mem->zcor != NULL)
    if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff,
                      liw_diff, y0, &step_mem->zcor)) {
      arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode::MRIStep",
                      "MRIStepResize", "Unable to resize vector");
      return(ARK_MEM_FAIL);
    }

  /* If a NLS object was previously used, destroy and recreate default Newton
     NLS object (can be replaced by user-defined object if desired) */
  if ((step_mem->NLS != NULL) && (step_mem->ownNLS)) {

    /* destroy existing NLS object */
    retval = SUNNonlinSolFree(step_mem->NLS);
    if (retval != ARK_SUCCESS)  return(retval);
    step_mem->NLS = NULL;
    step_mem->ownNLS = SUNFALSE;

    /* create new Newton NLS object */
    NLS = SUNNonlinSol_Newton(y0, ark_mem->sunctx);
    if (NLS == NULL) {
      arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode::MRIStep",
                      "MRIStepResize", "Error creating default Newton solver");
      return(ARK_MEM_FAIL);
    }

    /* attach new Newton NLS object to MRIStep */
    retval = MRIStepSetNonlinearSolver(ark_mem, NLS);
    if (retval != ARK_SUCCESS) {
      arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode::MRIStep",
                      "MRIStepResize", "Error attaching default Newton solver");
      return(ARK_MEM_FAIL);
    }
    step_mem->ownNLS = SUNTRUE;

  }

  /* Resize the inner stepper vectors */
  retval = mriStepInnerStepper_Resize(step_mem->stepper, resize, resize_data,
                                      lrw_diff, liw_diff, y0);
  if (retval != ARK_SUCCESS) {
    arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode::MRIStep",
                    "MRIStepResize", "Unable to resize vector");
    return(ARK_MEM_FAIL);
  }

  /* reset nonlinear solver counters */
  if (step_mem->NLS != NULL)  step_mem->nsetups = 0;

  return(ARK_SUCCESS);
}